

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csr.c
# Opt level: O0

int write_mtvec(CPURISCVState_conflict2 *env,int csrno,target_ulong val)

{
  target_ulong val_local;
  int csrno_local;
  CPURISCVState_conflict2 *env_local;
  
  if ((val & 3) < 2) {
    env->mtvec = val;
  }
  return 0;
}

Assistant:

static int write_mtvec(CPURISCVState *env, int csrno, target_ulong val)
{
    /* bits [1:0] encode mode; 0 = direct, 1 = vectored, 2 >= reserved */
    if ((val & 3) < 2) {
        env->mtvec = val;
    } else {
        qemu_log_mask(LOG_UNIMP, "CSR_MTVEC: reserved mode not supported\n");
    }
    return 0;
}